

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrate.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  char cVar2;
  ostream *poVar3;
  FileStorage *pFVar4;
  undefined8 uVar5;
  int y;
  int iVar6;
  pointer pbVar7;
  int x;
  int iVar8;
  ulong *local_2d0;
  Mat *local_2c8;
  ulong local_2c0 [2];
  float local_2ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fns;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  vpts2d;
  undefined8 local_270;
  FileStorage fs;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  vpts3d;
  WriteStructContext ws;
  string fn_params;
  string fp_images;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tmp;
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> tvecs;
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> rvecs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_130;
  int local_12c;
  Mat dis_cef;
  undefined4 uStack_124;
  Mat cam_mtx;
  int *local_80;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "0. Calibrate: input some images then get camera intrinsic params.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fp_images,"../images",(allocator<char> *)&cam_mtx);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&fp_images);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"image folder: ");
  poVar3 = std::operator<<(poVar3,(string *)&fp_images);
  std::endl<char,std::char_traits<char>>(poVar3);
  fns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_150,&fp_images,"/*.jpg");
  cv::glob(&local_150,&fns,0);
  std::__cxx11::string::~string((string *)&local_150);
  poVar3 = std::operator<<((ostream *)&std::cout,"num of images: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((ulong)((long)fns.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)fns.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    poVar3 = std::operator<<((ostream *)&std::cout,"too few images, abort");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar6 = 0;
        pbVar1 = fns.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, iVar6 != 6; iVar6 = iVar6 + 1) {
      local_2ac = (float)iVar6 * 50.0;
      for (iVar8 = 0; iVar8 != 9; iVar8 = iVar8 + 1) {
        _cam_mtx = (float)iVar8 * 50.0;
        _dis_cef = CONCAT44(uStack_124,local_2ac);
        _fs = 0;
        std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
        emplace_back<float,float,float>
                  ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&tmp,
                   (float *)&cam_mtx,(float *)&dis_cef,(float *)&fs);
      }
    }
    vpts2d.
    super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vpts3d.
    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vpts2d.
    super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vpts2d.
    super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vpts3d.
    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vpts3d.
    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar8 = 0;
    iVar6 = 0;
    for (pbVar7 = fns.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      cv::imread((string *)&cam_mtx,(int)pbVar7);
      cVar2 = cv::Mat::empty();
      if (cVar2 == '\0') {
        iVar6 = *local_80;
        iVar8 = local_80[1];
        _dis_cef = 0;
        _fs = 0x1010000;
        local_2c0[0] = 0;
        local_270 = 0x600000009;
        local_2d0 = (ulong *)CONCAT44(local_2d0._4_4_,0x8203000d);
        local_2c8 = &dis_cef;
        cVar2 = cv::findChessboardCorners(&fs,&local_270,&local_2d0,3);
        if (cVar2 != '\0') {
          std::
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          ::push_back(&vpts2d,(value_type *)&dis_cef);
          std::
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          ::push_back(&vpts3d,&tmp);
        }
        std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                  ((_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&dis_cef)
        ;
      }
      cv::Mat::~Mat(&cam_mtx);
    }
    if ((ulong)(((long)vpts2d.
                       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vpts2d.
                      super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 3) {
      poVar3 = std::operator<<((ostream *)&std::cout,"too few valid images, abort");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      cv::Mat::Mat(&cam_mtx);
      cv::Mat::Mat(&dis_cef);
      rvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _fs = 0x81040015;
      local_2c0[0] = 0;
      local_2d0 = (ulong *)CONCAT44(local_2d0._4_4_,0x8104000d);
      local_2c8 = (Mat *)&vpts2d;
      fn_params.field_2._M_allocated_capacity = 0;
      fn_params._M_dataplus._M_p._0_4_ = 0x3010000;
      _ws = 0x3010000;
      fn_params._M_string_length = (size_type)&cam_mtx;
      local_130 = iVar8;
      local_12c = iVar6;
      cv::calibrateCamera();
      cv::FileStorage::FileStorage(&fs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fn_params,"params.json",(allocator<char> *)&local_2d0);
      local_2c8 = (Mat *)0x0;
      local_2c0[0] = local_2c0[0] & 0xffffffffffffff00;
      local_2d0 = local_2c0;
      cVar2 = cv::FileStorage::open((string *)&fs,(int)&fn_params,(string *)0x1);
      std::__cxx11::string::~string((string *)&local_2d0);
      if (cVar2 != '\0') {
        pFVar4 = cv::operator<<(&fs,"cam_mtx");
        cv::operator<<(pFVar4,&cam_mtx);
        pFVar4 = cv::operator<<(&fs,"dis_cef");
        cv::operator<<(pFVar4,&dis_cef);
        pFVar4 = cv::operator<<(&fs,"image_size");
        cVar2 = (**(code **)(*(long *)pFVar4 + 0x18))(pFVar4);
        if (cVar2 != '\0') {
          if (*(int *)(pFVar4 + 8) == 6) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,"No element name has been given",(allocator<char> *)&ws)
            ;
            uVar5 = cv::error(-2,(string *)&local_2d0,"operator<<",
                              "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::__cxx11::string::~string((string *)&fn_params);
            cv::FileStorage::~FileStorage(&fs);
            std::_Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::
            ~_Vector_base(&tvecs.
                           super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                         );
            std::_Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::
            ~_Vector_base(&rvecs.
                           super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                         );
            cv::Mat::~Mat(&dis_cef);
            cv::Mat::~Mat(&cam_mtx);
            std::
            vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
            ::~vector(&vpts3d);
            std::
            vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
            ::~vector(&vpts2d);
            std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::
            ~_Vector_base(&tmp.
                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                         );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&fns);
            std::__cxx11::string::~string((string *)&fp_images);
            _Unwind_Resume(uVar5);
          }
          local_2c8 = (Mat *)0x0;
          local_2c0[0] = local_2c0[0] & 0xffffffffffffff00;
          local_2d0 = local_2c0;
          cv::internal::WriteStructContext::WriteStructContext
                    (&ws,pFVar4,(string *)(pFVar4 + 0x10),0xc,(string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          cv::writeScalar(pFVar4,iVar8);
          cv::writeScalar(pFVar4,iVar6);
          cv::internal::WriteStructContext::~WriteStructContext(&ws);
          if (((byte)pFVar4[8] & 4) != 0) {
            *(undefined4 *)(pFVar4 + 8) = 6;
          }
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"params written to ");
        poVar3 = std::operator<<(poVar3,(string *)&fn_params);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::__cxx11::string::~string((string *)&fn_params);
      cv::FileStorage::~FileStorage(&fs);
      std::_Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::~_Vector_base
                (&tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                );
      std::_Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::~_Vector_base
                (&rvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                );
      cv::Mat::~Mat(&dis_cef);
      cv::Mat::~Mat(&cam_mtx);
    }
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::~vector(&vpts3d);
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::~vector(&vpts2d);
    std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
              (&tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fns);
  std::__cxx11::string::~string((string *)&fp_images);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "0. Calibrate: input some images then get camera intrinsic params." << endl;

    string fp_images = "../images";
    if (argc > 1)
        fp_images = argv[1];
    cout << "image folder: " << fp_images << endl;

    // find images
    vector<String> fns;
    glob(fp_images + "/*.jpg", fns);
    cout << "num of images: " << fns.size() << endl;
    if (fns.size() < 3) {
        cout << "too few images, abort" << endl;
        return 0;
    }

    // detect points
    const int rows = 6;
    const int cols = 9;
    const float space = 50;
    vector<Point3f> tmp;
    for (int y = 0; y < rows; ++y)
        for (int x = 0; x < cols; ++x)
            tmp.emplace_back(x * space, y * space, 0.f);
    vector<vector<Point2f>> vpts2d;
    vector<vector<Point3f>> vpts3d;
    Size image_size;
    for (const auto& fn : fns) {
        auto image = imread(fn, IMREAD_GRAYSCALE);
        if (image.empty())
            continue;
        image_size = image.size();
        vector<Point2f> pts;
        if (findChessboardCorners(image, { cols, rows }, pts)) {
            vpts2d.push_back(pts);
            vpts3d.push_back(tmp);
        }
    }
    if (vpts2d.size() < 3) {
        cout << "too few valid images, abort" << endl;
        return 0;
    }

    // calibrate
    Mat cam_mtx, dis_cef;
    vector<Vec3d> rvecs, tvecs;
    calibrateCamera(vpts3d, vpts2d, image_size, cam_mtx, dis_cef, rvecs, tvecs);

    // output
    FileStorage fs;
    string fn_params = "params.json";
    if (fs.open(fn_params, FileStorage::WRITE)) {
        fs << "cam_mtx" << cam_mtx;
        fs << "dis_cef" << dis_cef;
        fs << "image_size" << image_size;
        cout << "params written to " << fn_params << endl;
    }

    return 0;
}